

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O3

void __thiscall
Rml::ControlledLifetimeResource<Rml::CoreData>::Initialize
          (ControlledLifetimeResource<Rml::CoreData> *this)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  CoreData *pCVar4;
  
  if (this->pointer != (CoreData *)0x0) {
    bVar3 = Assert("Resource already initialized.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x2e);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  pCVar4 = (CoreData *)operator_new(0x68);
  psVar1 = &(pCVar4->contexts).mMask;
  (pCVar4->default_system_interface)._M_t.
  super___uniq_ptr_impl<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>._M_t.
  super__Tuple_impl<0UL,_Rml::SystemInterface_*,_std::default_delete<Rml::SystemInterface>_>.
  super__Head_base<0UL,_Rml::SystemInterface_*,_false>._M_head_impl = (SystemInterface *)0x0;
  (pCVar4->default_file_interface)._M_t.
  super___uniq_ptr_impl<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>._M_t.
  super__Tuple_impl<0UL,_Rml::FileInterface_*,_std::default_delete<Rml::FileInterface>_>.
  super__Head_base<0UL,_Rml::FileInterface_*,_false>._M_head_impl = (FileInterface *)0x0;
  (pCVar4->default_font_interface)._M_t.
  super___uniq_ptr_impl<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_Rml::FontEngineInterface_*,_std::default_delete<Rml::FontEngineInterface>_>
  .super__Head_base<0UL,_Rml::FontEngineInterface_*,_false>._M_head_impl =
       (FontEngineInterface *)0x0;
  (pCVar4->default_text_input_handler)._M_t.
  super___uniq_ptr_impl<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>._M_t.
  super__Tuple_impl<0UL,_Rml::TextInputHandler_*,_std::default_delete<Rml::TextInputHandler>_>.
  super__Head_base<0UL,_Rml::TextInputHandler_*,_false>._M_head_impl = (TextInputHandler *)0x0;
  (pCVar4->render_managers).m_container.
  super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar4->render_managers).m_container.
  super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar4->render_managers).m_container.
  super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar4->contexts).mKeyVals = (Node *)psVar1;
  (pCVar4->contexts).mInfo = (uint8_t *)psVar1;
  (pCVar4->contexts).mNumElements = 0;
  (pCVar4->contexts).mMask = 0;
  (pCVar4->contexts).mMaxNumElementsAllowed = 0;
  (pCVar4->contexts).mInfoInc = 0x20;
  (pCVar4->contexts).mInfoHashShift = 0;
  this->pointer = pCVar4;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}